

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O1

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  bool bVar20;
  
  iVar3 = bottom_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    Mat::create(top_blob,iVar3,iVar5,uVar4,4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    uVar16 = iVar5 * iVar3;
    if (this->bias_data_size == 0) {
      if (0 < (int)uVar4) {
        pvVar14 = bottom_blob->data;
        sVar10 = bottom_blob->cstep;
        pvVar18 = top_blob->data;
        sVar11 = top_blob->cstep;
        iVar3 = this->scale_data_size;
        sVar12 = top_blob->elemsize;
        sVar13 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          uVar17 = 0;
          if (iVar3 != 1) {
            uVar17 = uVar15 & 0xffffffff;
          }
          if (0 < (int)uVar16) {
            fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar18 + uVar17 * 4) =
                   (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar16 != uVar17);
          }
          uVar15 = uVar15 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar11 * sVar12);
          pvVar14 = (void *)((long)pvVar14 + sVar10 * sVar13);
        } while (uVar15 != uVar4);
      }
    }
    else if (0 < (int)uVar4) {
      pvVar14 = bottom_blob->data;
      sVar10 = bottom_blob->cstep;
      pvVar18 = top_blob->data;
      sVar11 = top_blob->cstep;
      iVar3 = this->scale_data_size;
      iVar5 = this->bias_data_size;
      sVar12 = top_blob->elemsize;
      sVar13 = bottom_blob->elemsize;
      uVar15 = 0;
      do {
        uVar17 = uVar15 & 0xffffffff;
        if (iVar3 == 1) {
          uVar17 = 0;
        }
        uVar19 = uVar15 & 0xffffffff;
        if (iVar5 == 1) {
          uVar19 = 0;
        }
        if (0 < (int)uVar16) {
          fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
          fVar2 = *(float *)((long)(this->bias_data).data + uVar19 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar18 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1 + fVar2;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        uVar15 = uVar15 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar11 * sVar12);
        pvVar14 = (void *)((long)pvVar14 + sVar10 * sVar13);
      } while (uVar15 != uVar4);
    }
    if (bVar20) {
      return -100;
    }
  }
  else if (iVar3 == 2) {
    uVar4 = bottom_blob->w;
    uVar16 = bottom_blob->h;
    Mat::create(top_blob,uVar4,uVar16,4,opt->blob_allocator);
    pvVar14 = top_blob->data;
    if (pvVar14 == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    iVar3 = this->bias_data_size;
    if (iVar3 == 0) {
      if (0 < (int)uVar16) {
        pvVar18 = bottom_blob->data;
        iVar3 = bottom_blob->w;
        iVar5 = top_blob->w;
        sVar10 = top_blob->elemsize;
        iVar6 = this->scale_data_size;
        sVar11 = bottom_blob->elemsize;
        uVar15 = 0;
        do {
          uVar17 = 0;
          if (iVar6 != 1) {
            uVar17 = uVar15 & 0xffffffff;
          }
          if (0 < (int)uVar4) {
            fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar14 + uVar17 * 4) =
                   (float)*(int *)((long)pvVar18 + uVar17 * 4) * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar4 != uVar17);
          }
          uVar15 = uVar15 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)iVar5 * sVar10);
          pvVar18 = (void *)((long)pvVar18 + (long)iVar3 * sVar11);
        } while (uVar15 != uVar16);
      }
    }
    else if (0 < (int)uVar16) {
      pvVar18 = bottom_blob->data;
      iVar5 = bottom_blob->w;
      iVar6 = top_blob->w;
      iVar7 = this->scale_data_size;
      sVar10 = top_blob->elemsize;
      sVar11 = bottom_blob->elemsize;
      uVar15 = 0;
      do {
        uVar17 = uVar15 & 0xffffffff;
        if (iVar7 == 1) {
          uVar17 = 0;
        }
        uVar19 = uVar15 & 0xffffffff;
        if (iVar3 == 1) {
          uVar19 = 0;
        }
        if (0 < (int)uVar4) {
          fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
          fVar2 = *(float *)((long)(this->bias_data).data + uVar19 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar14 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar18 + uVar17 * 4) * fVar1 + fVar2;
            uVar17 = uVar17 + 1;
          } while (uVar4 != uVar17);
        }
        uVar15 = uVar15 + 1;
        pvVar14 = (void *)((long)pvVar14 + (long)iVar6 * sVar10);
        pvVar18 = (void *)((long)pvVar18 + (long)iVar5 * sVar11);
      } while (uVar15 != uVar16);
    }
    if (bVar20) {
      return -100;
    }
  }
  else if (iVar3 == 1) {
    uVar4 = bottom_blob->w;
    uVar15 = (ulong)uVar4;
    Mat::create(top_blob,uVar4,4,opt->blob_allocator);
    pvVar14 = top_blob->data;
    if (pvVar14 == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pvVar18 = bottom_blob->data;
    if (this->scale_data_size == 1) {
      fVar1 = *(this->scale_data).data;
      if (this->bias_data_size == 1) {
        if (0 < (int)uVar4) {
          fVar2 = *(this->bias_data).data;
          uVar17 = 0;
          do {
            *(float *)((long)pvVar14 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar18 + uVar17 * 4) * fVar1 + fVar2;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (this->bias_data_size == 0) {
        if (0 < (int)uVar4) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar14 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar18 + uVar17 * 4) * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
      }
      else if (0 < (int)uVar4) {
        pvVar8 = (this->bias_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar14 + uVar17 * 4) =
               (float)*(int *)((long)pvVar18 + uVar17 * 4) * fVar1 +
               *(float *)((long)pvVar8 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    else if (this->bias_data_size == 1) {
      if (0 < (int)uVar4) {
        fVar1 = *(this->bias_data).data;
        pvVar8 = (this->scale_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar14 + uVar17 * 4) =
               (float)*(int *)((long)pvVar18 + uVar17 * 4) * *(float *)((long)pvVar8 + uVar17 * 4) +
               fVar1;
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    else if (this->bias_data_size == 0) {
      if (0 < (int)uVar4) {
        pvVar8 = (this->scale_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar14 + uVar17 * 4) =
               (float)*(int *)((long)pvVar18 + uVar17 * 4) * *(float *)((long)pvVar8 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
    }
    else if (0 < (int)uVar4) {
      pvVar8 = (this->scale_data).data;
      pvVar9 = (this->bias_data).data;
      uVar17 = 0;
      do {
        *(float *)((long)pvVar14 + uVar17 * 4) =
             (float)*(int *)((long)pvVar18 + uVar17 * 4) * *(float *)((long)pvVar8 + uVar17 * 4) +
             *(float *)((long)pvVar9 + uVar17 * 4);
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}